

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CopyFileTime(char *fromFile,char *toFile)

{
  int iVar1;
  undefined1 local_c0 [8];
  utimbuf buf;
  stat fromStat;
  char *toFile_local;
  char *fromFile_local;
  
  iVar1 = stat64(fromFile,(stat64 *)&buf.modtime);
  if (iVar1 < 0) {
    fromFile_local._7_1_ = false;
  }
  else {
    iVar1 = utime(toFile,(utimbuf *)local_c0);
    if (iVar1 < 0) {
      fromFile_local._7_1_ = false;
    }
    else {
      fromFile_local._7_1_ = true;
    }
  }
  return fromFile_local._7_1_;
}

Assistant:

bool cmSystemTools::CopyFileTime(const char* fromFile, const char* toFile)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle hFrom =
    CreateFileW(SystemTools::ConvertToWindowsExtendedPath(fromFile).c_str(),
                GENERIC_READ, FILE_SHARE_READ, 0,
                OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  cmSystemToolsWindowsHandle hTo =
    CreateFileW(SystemTools::ConvertToWindowsExtendedPath(toFile).c_str(),
                FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING,
                FILE_FLAG_BACKUP_SEMANTICS, 0);
  if(!hFrom || !hTo)
    {
    return false;
    }
  FILETIME timeCreation;
  FILETIME timeLastAccess;
  FILETIME timeLastWrite;
  if(!GetFileTime(hFrom, &timeCreation, &timeLastAccess, &timeLastWrite))
    {
    return false;
    }
  if(!SetFileTime(hTo, &timeCreation, &timeLastAccess, &timeLastWrite))
    {
    return false;
    }
#else
  struct stat fromStat;
  if(stat(fromFile, &fromStat) < 0)
    {
    return false;
    }

  struct utimbuf buf;
  buf.actime = fromStat.st_atime;
  buf.modtime = fromStat.st_mtime;
  if(utime(toFile, &buf) < 0)
    {
    return false;
    }
#endif
  return true;
}